

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.h
# Opt level: O0

void __thiscall adios2::format::BPBase::Stats<int>::Stats(Stats<int> *this)

{
  BPOpInfo *in_RDI;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xafc198);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xafc1a6);
  helper::BlockDivisionInfo::BlockDivisionInfo((BlockDivisionInfo *)in_RDI);
  (((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&in_RDI[1].Metadata)->_M_impl).
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&in_RDI[1].Metadata)->_M_impl).
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&in_RDI[1].Metadata)->_M_impl).
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined4 *)
   &in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  *(BlockDivisionMethod *)
   ((long)&in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = Contiguous;
  *(undefined4 *)
   &in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].PreShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined4 *)
   &in_RDI[1].PreCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].PreCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &in_RDI[1].PreCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  std::bitset<32UL>::bitset((bitset<32UL> *)0xafc237);
  *(undefined1 *)
   &in_RDI[1].PreStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].PreStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 1) = 0;
  BPOpInfo::BPOpInfo(in_RDI);
  return;
}

Assistant:

Stats() : Min(), Max(), Value() {}